

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O3

void * magma_cbc_cipher_newctx(void *provctx)

{
  GOST_CTX *pGVar1;
  
  pGVar1 = cipher_newctx(provctx,&magma_cbc_cipher,(OSSL_PARAM *)0x0);
  return pGVar1;
}

Assistant:

static GOST_CTX *cipher_newctx(void *provctx, GOST_cipher *descriptor,
                                const OSSL_PARAM *known_params)
{
    GOST_CTX *gctx = NULL;

    if ((gctx = OPENSSL_zalloc(sizeof(*gctx))) != NULL) {
        gctx->provctx = provctx;
        gctx->known_params = known_params;
        gctx->descriptor = descriptor;
        gctx->cipher = GOST_init_cipher(descriptor);
        gctx->cctx = EVP_CIPHER_CTX_new();

        if (gctx->cipher == NULL || gctx->cctx == NULL) {
            cipher_freectx(gctx);
            gctx = NULL;
        }
    }
    return gctx;
}